

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall
TestReaderTestparseWithNoErrorsTestingOffsets::runTestCase
          (TestReaderTestparseWithNoErrorsTestingOffsets *this)

{
  size_type sVar1;
  bool bVar2;
  Value *pVVar3;
  size_t sVar4;
  allocator local_179;
  Value root;
  string local_150;
  Reader reader;
  
  Json::Reader::Reader(&reader);
  Json::Value::Value(&root,nullValue);
  std::__cxx11::string::string
            ((string *)&local_150,
             "{ \"property\" : [\"value\", \"value2\"], \"obj\" : { \"nested\" : 123, \"bool\" : true}, \"null\" : null, \"false\" : false }"
             ,&local_179);
  bVar2 = Json::Reader::parse(&reader,&local_150,&root,true);
  std::__cxx11::string::~string((string *)&local_150);
  if (!bVar2) {
    JsonTest::TestResult::addFailure
              ((this->super_ReaderTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x6a6,"ok");
  }
  Json::Reader::getFormattedErrorMessages_abi_cxx11_(&local_150,&reader);
  sVar1 = local_150._M_string_length;
  std::__cxx11::string::~string((string *)&local_150);
  if ((pointer)sVar1 != (pointer)0x0) {
    JsonTest::TestResult::addFailure
              ((this->super_ReaderTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x6a7,"reader.getFormattedErrorMessages().size() == 0");
  }
  Json::Reader::getStructuredErrors
            ((vector<Json::Reader::StructuredError,_std::allocator<Json::Reader::StructuredError>_>
              *)&local_150,&reader);
  std::vector<Json::Reader::StructuredError,_std::allocator<Json::Reader::StructuredError>_>::
  ~vector((vector<Json::Reader::StructuredError,_std::allocator<Json::Reader::StructuredError>_> *)
          &local_150);
  if ((pointer)local_150._M_string_length != local_150._M_dataplus._M_p) {
    JsonTest::TestResult::addFailure
              ((this->super_ReaderTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x6a8,"reader.getStructuredErrors().size() == 0");
  }
  pVVar3 = Json::Value::operator[](&root,"property");
  sVar4 = Json::Value::getOffsetStart(pVVar3);
  if (sVar4 != 0xf) {
    JsonTest::TestResult::addFailure
              ((this->super_ReaderTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x6a9,"root[\"property\"].getOffsetStart() == 15");
  }
  pVVar3 = Json::Value::operator[](&root,"property");
  sVar4 = Json::Value::getOffsetLimit(pVVar3);
  if (sVar4 != 0x22) {
    JsonTest::TestResult::addFailure
              ((this->super_ReaderTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x6aa,"root[\"property\"].getOffsetLimit() == 34");
  }
  pVVar3 = Json::Value::operator[](&root,"property");
  pVVar3 = Json::Value::operator[](pVVar3,0);
  sVar4 = Json::Value::getOffsetStart(pVVar3);
  if (sVar4 != 0x10) {
    JsonTest::TestResult::addFailure
              ((this->super_ReaderTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x6ab,"root[\"property\"][0].getOffsetStart() == 16");
  }
  pVVar3 = Json::Value::operator[](&root,"property");
  pVVar3 = Json::Value::operator[](pVVar3,0);
  sVar4 = Json::Value::getOffsetLimit(pVVar3);
  if (sVar4 != 0x17) {
    JsonTest::TestResult::addFailure
              ((this->super_ReaderTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x6ac,"root[\"property\"][0].getOffsetLimit() == 23");
  }
  pVVar3 = Json::Value::operator[](&root,"property");
  pVVar3 = Json::Value::operator[](pVVar3,1);
  sVar4 = Json::Value::getOffsetStart(pVVar3);
  if (sVar4 != 0x19) {
    JsonTest::TestResult::addFailure
              ((this->super_ReaderTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x6ad,"root[\"property\"][1].getOffsetStart() == 25");
  }
  pVVar3 = Json::Value::operator[](&root,"property");
  pVVar3 = Json::Value::operator[](pVVar3,1);
  sVar4 = Json::Value::getOffsetLimit(pVVar3);
  if (sVar4 != 0x21) {
    JsonTest::TestResult::addFailure
              ((this->super_ReaderTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x6ae,"root[\"property\"][1].getOffsetLimit() == 33");
  }
  pVVar3 = Json::Value::operator[](&root,"obj");
  sVar4 = Json::Value::getOffsetStart(pVVar3);
  if (sVar4 != 0x2c) {
    JsonTest::TestResult::addFailure
              ((this->super_ReaderTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x6af,"root[\"obj\"].getOffsetStart() == 44");
  }
  pVVar3 = Json::Value::operator[](&root,"obj");
  sVar4 = Json::Value::getOffsetLimit(pVVar3);
  if (sVar4 != 0x4c) {
    JsonTest::TestResult::addFailure
              ((this->super_ReaderTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x6b0,"root[\"obj\"].getOffsetLimit() == 76");
  }
  pVVar3 = Json::Value::operator[](&root,"obj");
  pVVar3 = Json::Value::operator[](pVVar3,"nested");
  sVar4 = Json::Value::getOffsetStart(pVVar3);
  if (sVar4 != 0x39) {
    JsonTest::TestResult::addFailure
              ((this->super_ReaderTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x6b1,"root[\"obj\"][\"nested\"].getOffsetStart() == 57");
  }
  pVVar3 = Json::Value::operator[](&root,"obj");
  pVVar3 = Json::Value::operator[](pVVar3,"nested");
  sVar4 = Json::Value::getOffsetLimit(pVVar3);
  if (sVar4 != 0x3c) {
    JsonTest::TestResult::addFailure
              ((this->super_ReaderTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x6b2,"root[\"obj\"][\"nested\"].getOffsetLimit() == 60");
  }
  pVVar3 = Json::Value::operator[](&root,"obj");
  pVVar3 = Json::Value::operator[](pVVar3,"bool");
  sVar4 = Json::Value::getOffsetStart(pVVar3);
  if (sVar4 != 0x47) {
    JsonTest::TestResult::addFailure
              ((this->super_ReaderTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x6b3,"root[\"obj\"][\"bool\"].getOffsetStart() == 71");
  }
  pVVar3 = Json::Value::operator[](&root,"obj");
  pVVar3 = Json::Value::operator[](pVVar3,"bool");
  sVar4 = Json::Value::getOffsetLimit(pVVar3);
  if (sVar4 != 0x4b) {
    JsonTest::TestResult::addFailure
              ((this->super_ReaderTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x6b4,"root[\"obj\"][\"bool\"].getOffsetLimit() == 75");
  }
  pVVar3 = Json::Value::operator[](&root,"null");
  sVar4 = Json::Value::getOffsetStart(pVVar3);
  if (sVar4 != 0x57) {
    JsonTest::TestResult::addFailure
              ((this->super_ReaderTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x6b5,"root[\"null\"].getOffsetStart() == 87");
  }
  pVVar3 = Json::Value::operator[](&root,"null");
  sVar4 = Json::Value::getOffsetLimit(pVVar3);
  if (sVar4 != 0x5b) {
    JsonTest::TestResult::addFailure
              ((this->super_ReaderTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x6b6,"root[\"null\"].getOffsetLimit() == 91");
  }
  pVVar3 = Json::Value::operator[](&root,"false");
  sVar4 = Json::Value::getOffsetStart(pVVar3);
  if (sVar4 != 0x67) {
    JsonTest::TestResult::addFailure
              ((this->super_ReaderTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x6b7,"root[\"false\"].getOffsetStart() == 103");
  }
  pVVar3 = Json::Value::operator[](&root,"false");
  sVar4 = Json::Value::getOffsetLimit(pVVar3);
  if (sVar4 != 0x6c) {
    JsonTest::TestResult::addFailure
              ((this->super_ReaderTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x6b8,"root[\"false\"].getOffsetLimit() == 108");
  }
  sVar4 = Json::Value::getOffsetStart(&root);
  if (sVar4 != 0) {
    JsonTest::TestResult::addFailure
              ((this->super_ReaderTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x6b9,"root.getOffsetStart() == 0");
  }
  sVar4 = Json::Value::getOffsetLimit(&root);
  if (sVar4 != 0x6e) {
    JsonTest::TestResult::addFailure
              ((this->super_ReaderTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x6ba,"root.getOffsetLimit() == 110");
  }
  Json::Value::~Value(&root);
  Json::Reader::~Reader(&reader);
  return;
}

Assistant:

JSONTEST_FIXTURE(ReaderTest, parseWithNoErrorsTestingOffsets) {
  Json::Reader reader;
  Json::Value root;
  bool ok = reader.parse("{ \"property\" : [\"value\", \"value2\"], \"obj\" : "
                         "{ \"nested\" : 123, \"bool\" : true}, \"null\" : "
                         "null, \"false\" : false }",
                         root);
  JSONTEST_ASSERT(ok);
  JSONTEST_ASSERT(reader.getFormattedErrorMessages().size() == 0);
  JSONTEST_ASSERT(reader.getStructuredErrors().size() == 0);
  JSONTEST_ASSERT(root["property"].getOffsetStart() == 15);
  JSONTEST_ASSERT(root["property"].getOffsetLimit() == 34);
  JSONTEST_ASSERT(root["property"][0].getOffsetStart() == 16);
  JSONTEST_ASSERT(root["property"][0].getOffsetLimit() == 23);
  JSONTEST_ASSERT(root["property"][1].getOffsetStart() == 25);
  JSONTEST_ASSERT(root["property"][1].getOffsetLimit() == 33);
  JSONTEST_ASSERT(root["obj"].getOffsetStart() == 44);
  JSONTEST_ASSERT(root["obj"].getOffsetLimit() == 76);
  JSONTEST_ASSERT(root["obj"]["nested"].getOffsetStart() == 57);
  JSONTEST_ASSERT(root["obj"]["nested"].getOffsetLimit() == 60);
  JSONTEST_ASSERT(root["obj"]["bool"].getOffsetStart() == 71);
  JSONTEST_ASSERT(root["obj"]["bool"].getOffsetLimit() == 75);
  JSONTEST_ASSERT(root["null"].getOffsetStart() == 87);
  JSONTEST_ASSERT(root["null"].getOffsetLimit() == 91);
  JSONTEST_ASSERT(root["false"].getOffsetStart() == 103);
  JSONTEST_ASSERT(root["false"].getOffsetLimit() == 108);
  JSONTEST_ASSERT(root.getOffsetStart() == 0);
  JSONTEST_ASSERT(root.getOffsetLimit() == 110);
}